

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::LinearDerivateCase::LinearDerivateCase
          (LinearDerivateCase *this,Context *context,char *name,char *description,DerivateFunc func,
          DataType type,Precision precision,deUint32 hint,SurfaceType surfaceType,int numSamples,
          char *fragmentSrcTmpl)

{
  allocator<char> local_31;
  DataType local_30;
  DerivateFunc local_2c;
  DataType type_local;
  DerivateFunc func_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  LinearDerivateCase *this_local;
  
  local_30 = type;
  local_2c = func;
  _type_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,context,name,description);
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LinearDerivateCase_015a9c90;
  *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4 = local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentTmpl,fragmentSrcTmpl,&local_31);
  std::allocator<char>::~allocator(&local_31);
  (this->super_TriangleDerivateCase).m_dataType = local_30;
  (this->super_TriangleDerivateCase).m_precision = precision;
  (this->super_TriangleDerivateCase).m_coordDataType = (this->super_TriangleDerivateCase).m_dataType
  ;
  (this->super_TriangleDerivateCase).m_coordPrecision =
       (this->super_TriangleDerivateCase).m_precision;
  (this->super_TriangleDerivateCase).m_hint = hint;
  (this->super_TriangleDerivateCase).m_surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_numSamples = numSamples;
  return;
}

Assistant:

LinearDerivateCase::LinearDerivateCase (Context& context, const char* name, const char* description, DerivateFunc func, glu::DataType type, glu::Precision precision, deUint32 hint, SurfaceType surfaceType, int numSamples, const char* fragmentSrcTmpl)
	: TriangleDerivateCase	(context, name, description)
	, m_func				(func)
	, m_fragmentTmpl		(fragmentSrcTmpl)
{
	m_dataType			= type;
	m_precision			= precision;
	m_coordDataType		= m_dataType;
	m_coordPrecision	= m_precision;
	m_hint				= hint;
	m_surfaceType		= surfaceType;
	m_numSamples		= numSamples;
}